

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  byte bVar6;
  ulong *puVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  bool bVar13;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar5 = HUF_decompress1X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar5;
  }
  if (bmi2 != 0) {
    sVar5 = HUF_decompress1X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar5;
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar4 = 0;
    uVar10 = 0;
    puVar12 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puVar7 = (ulong *)0x0;
  }
  else {
    puVar7 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar10 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar10 = uVar10 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar10 = uVar10 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar10 = uVar10 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar10 = uVar10 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar10 = uVar10 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar10 = uVar10 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar2 = 0x1f;
        if (bVar6 != 0) {
          for (; bVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        if (bVar6 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar2 = 0;
        }
        else {
          uVar2 = ~uVar2 + (int)cSrcSize * -8 + 0x49;
        }
        uVar4 = (ulong)uVar2;
        puVar12 = (ulong *)cSrc;
      }
    }
    else {
      puVar12 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar10 = *puVar12;
      bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar2 = 0x1f;
      if (bVar6 != 0) {
        for (; bVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = ~uVar2 + 9;
      if (bVar6 == 0) {
        uVar2 = 0;
      }
      uVar4 = (ulong)uVar2;
      cSrcSize = cSrcSize | -(ulong)(bVar6 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  uVar2 = *DTable;
  puVar1 = (undefined1 *)((long)dst + maxDstSize);
  bVar6 = -(char)(uVar2 >> 0x10) & 0x3f;
  do {
    uVar3 = (uint)uVar4;
    if (uVar3 < 0x41) {
      if (puVar12 < puVar7) {
        if (puVar12 == (ulong *)cSrc) goto LAB_001615c9;
        bVar13 = cSrc <= (ulong *)((long)puVar12 - (uVar4 >> 3));
        uVar8 = (int)puVar12 - (int)cSrc;
        if (bVar13) {
          uVar8 = (uint)(uVar4 >> 3);
        }
        uVar3 = uVar3 + uVar8 * -8;
      }
      else {
        uVar8 = (uint)(uVar4 >> 3);
        uVar3 = uVar3 & 7;
        bVar13 = true;
      }
      uVar4 = (ulong)uVar3;
      puVar12 = (ulong *)((long)puVar12 - (ulong)uVar8);
      uVar10 = *puVar12;
    }
    else {
LAB_001615c9:
      bVar13 = false;
    }
    uVar3 = (uint)uVar4;
    if ((puVar1 + -3 <= dst) || (!bVar13)) {
      if (puVar1 <= dst) goto LAB_001616e8;
      if ((uVar2 & 0xff0000) != 0) {
        do {
          uVar11 = (uVar10 << ((byte)uVar4 & 0x3f)) >> bVar6;
          uVar3 = (int)uVar4 + (uint)*(byte *)((long)DTable + uVar11 * 2 + 5);
          uVar4 = (ulong)uVar3;
          *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
          dst = (void *)((long)dst + 1);
        } while (dst < puVar1);
LAB_001616e8:
        if (uVar3 != 0x40) {
          maxDstSize = 0xffffffffffffffec;
        }
        if (puVar12 == (ulong *)cSrc) {
          return maxDstSize;
        }
        return 0xffffffffffffffec;
      }
LAB_00161713:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    if ((uVar2 & 0xff0000) == 0) goto LAB_00161713;
    uVar11 = (uVar10 << ((byte)uVar4 & 0x3f)) >> bVar6;
    iVar9 = *(byte *)((long)DTable + uVar11 * 2 + 5) + uVar3;
    uVar4 = (uVar10 << ((byte)iVar9 & 0x3f)) >> bVar6;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    iVar9 = (uint)*(byte *)((long)DTable + uVar4 * 2 + 5) + iVar9;
    uVar11 = (uVar10 << ((byte)iVar9 & 0x3f)) >> bVar6;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar4 * 2 + 4);
    iVar9 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar9;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    uVar11 = (uVar10 << ((byte)iVar9 & 0x3f)) >> bVar6;
    uVar4 = (ulong)((uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + iVar9);
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    dst = (void *)((long)dst + 4);
  } while( true );
}

Assistant:

size_t HUF_decompress1X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}